

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-elastic-local-frame-dynamical-system.cpp
# Opt level: O1

Vector __thiscall
stateObservation::flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::measureDynamics
          (IMUElasticLocalFrameDynamicalSystem *this,Vector *x,Vector *u,uint k)

{
  AlgebraicSensor *this_00;
  Index *pIVar1;
  Index *pIVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  Index *pIVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double *pdVar9;
  void *__ptr;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double *pdVar16;
  undefined8 uVar17;
  Index IVar18;
  Index IVar19;
  Index IVar20;
  char cVar21;
  uint uVar22;
  Index size;
  DenseStorage<double,__1,__1,__1,_0> *this_01;
  reference pMVar23;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar24;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_02;
  undefined4 in_register_0000000c;
  char *pcVar25;
  double *pdVar26;
  double *pdVar27;
  Index extraout_RDX;
  ActualDstType actualDst;
  uint uVar28;
  ActualDstType actualDst_4;
  long lVar29;
  long lVar30;
  ulong uVar31;
  uint in_R8D;
  ulong uVar32;
  Index index_2;
  ulong uVar33;
  Index index_3;
  ulong uVar34;
  ulong uVar35;
  ActualDstType actualDst_3;
  long lVar36;
  bool bVar37;
  double dVar38;
  double dVar39;
  double *pdVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  Vector VVar44;
  double adStack_cc0 [290];
  undefined8 uStack_3b0;
  Matrix3 *pMStack_3a8;
  Index *pIStack_3a0;
  Vector *pVStack_398;
  Index *pIStack_390;
  Vector *pVStack_388;
  Index *pIStack_380;
  Vector *pVStack_378;
  Index *pIStack_370;
  Index *pIStack_368;
  Vector *pVStack_360;
  Index *pIStack_358;
  Index *pIStack_350;
  Index *pIStack_348;
  Vector *pVStack_340;
  Index *pIStack_338;
  Index *pIStack_330;
  Vector *pVStack_328;
  undefined1 *puStack_320;
  IndexedMatrixArray *local_318;
  undefined8 uStack_310;
  Vector *local_308;
  double *pdStack_300;
  undefined1 local_2f8 [28];
  uint local_2dc;
  type tmp;
  double dStack_260;
  double dStack_240;
  ActualDstType actualDst_2;
  SrcEvaluatorType srcEvaluator;
  Index *local_1c8;
  Vector *local_1c0;
  Scalar local_1b8;
  double *pdStack_1b0;
  ulong local_1a8;
  double local_1a0;
  undefined8 uStack_198;
  double *local_190;
  double local_188;
  double dStack_180;
  undefined8 local_178;
  Scalar local_170;
  Scalar local_168 [2];
  Scalar local_158;
  double dStack_150;
  double local_148;
  double dStack_140;
  double local_138;
  double dStack_130;
  double local_128;
  double dStack_120;
  double local_118;
  Scalar local_108;
  double adStack_100 [5];
  double local_d8;
  double dStack_d0;
  double local_c8;
  undefined8 local_c0;
  Scalar *local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  Vector6 local_98;
  Vector6 local_68;
  
  puStack_320 = (undefined1 *)0x15cb34;
  cVar21 = (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data[8])(x,u);
  if (cVar21 == '\0') {
    puStack_320 = (undefined1 *)0x15eb84;
    __assert_fail("checkStateVector(v) && \"ERROR: The state vector has the wrong size\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/dynamical-system/dynamical-system-functor-base.hpp"
                  ,0x42,
                  "void stateObservation::DynamicalSystemFunctorBase::assertStateVector_(const Vector &)"
                 );
  }
  puStack_320 = (undefined1 *)0x15cb55;
  local_308 = (Vector *)CONCAT44(in_register_0000000c,k);
  cVar21 = (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data[9])(x);
  if (cVar21 == '\0') {
    puStack_320 = (undefined1 *)0x15eba3;
    __assert_fail("checkInputvector(v) && \"ERROR: The input vector has the wrong size\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/dynamical-system/dynamical-system-functor-base.hpp"
                  ,0x47,
                  "void stateObservation::DynamicalSystemFunctorBase::assertInputVector_(const Vector &)"
                 );
  }
  pIVar1 = &x[0x1a].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  pdVar27 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  pdVar26 = (double *)
            (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (x[0x1b].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      pdVar26) {
    if ((long)pdVar26 < 0) goto LAB_0015ec60;
    puStack_320 = (undefined1 *)0x15cb91;
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)pIVar1,(Index)pdVar26,(Index)pdVar26,1);
  }
  pdVar9 = x[0x1b].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if (pdVar9 != pdVar26) {
LAB_0015eba5:
    pcVar25 = 
    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
    ;
LAB_0015eb25:
    puStack_320 = (undefined1 *)0x15eb2f;
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar25);
  }
  lVar36 = *pIVar1;
  pdVar26 = (double *)((long)pdVar9 - ((long)pdVar9 >> 0x3f) & 0xfffffffffffffffe);
  if (1 < (long)pdVar9) {
    lVar29 = 0;
    do {
      pdVar40 = pdVar27 + lVar29;
      dVar6 = pdVar40[1];
      pdVar16 = (double *)(lVar36 + lVar29 * 8);
      *pdVar16 = *pdVar40;
      pdVar16[1] = dVar6;
      lVar29 = lVar29 + 2;
    } while (lVar29 < (long)pdVar26);
  }
  if ((long)pdVar26 < (long)pdVar9) {
    do {
      *(double *)(lVar36 + (long)pdVar26 * 8) = pdVar27[(long)pdVar26];
      pdVar26 = (double *)((long)pdVar26 + 1);
    } while (pdVar9 != pdVar26);
  }
  pIVar1 = &x[0x1c].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  lVar36 = *(long *)local_308;
  pdVar27 = *(double **)((long)local_308 + 8);
  if (x[0x1d].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      pdVar27) {
    if ((long)pdVar27 < 0) {
LAB_0015ec60:
      puStack_320 = (undefined1 *)0x15ec7f;
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    puStack_320 = (undefined1 *)0x15cc1e;
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)pIVar1,(Index)pdVar27,(Index)pdVar27,1);
  }
  pdVar26 = x[0x1d].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if (pdVar26 != pdVar27) goto LAB_0015eba5;
  lVar29 = *pIVar1;
  pdVar27 = (double *)((long)pdVar26 - ((long)pdVar26 >> 0x3f) & 0xfffffffffffffffe);
  if (1 < (long)pdVar26) {
    lVar30 = 0;
    do {
      puVar3 = (undefined8 *)(lVar36 + lVar30 * 8);
      uVar17 = puVar3[1];
      puVar4 = (undefined8 *)(lVar29 + lVar30 * 8);
      *puVar4 = *puVar3;
      puVar4[1] = uVar17;
      lVar30 = lVar30 + 2;
    } while (lVar30 < (long)pdVar27);
  }
  if ((long)pdVar27 < (long)pdVar26) {
    do {
      *(undefined8 *)(lVar29 + (long)pdVar27 * 8) = *(undefined8 *)(lVar36 + (long)pdVar27 * 8);
      pdVar27 = (double *)((long)pdVar27 + 1);
    } while (pdVar26 != pdVar27);
  }
  *(uint *)&x[0x6f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = in_R8D;
  if (2 < (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    pdVar27 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar6 = pdVar27[1];
    x[0x4a].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)*pdVar27;
    x[0x4a].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)dVar6;
    x[0x4b].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)pdVar27[2];
    if (8 < (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      pdVar27 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      pdVar26 = (double *)pdVar27[7];
      x[0x4b].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           (Index)pdVar27[6];
      x[0x4c].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar26;
      x[0x4c].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           (Index)pdVar27[8];
      if (5 < (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
      {
        pdVar27 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data;
        pdVar26 = (double *)pdVar27[4];
        x[0x4e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             (Index)pdVar27[3];
        x[0x4f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             pdVar26;
        x[0x4f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             (Index)pdVar27[5];
        if (0xb < (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows) {
          local_1c0 = x + 0x4a;
          local_1c8 = &x[0x4b].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows;
          pdVar27 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data;
          dVar6 = pdVar27[10];
          x[0x50].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
               (double *)pdVar27[9];
          x[0x50].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
               (Index)dVar6;
          x[0x51].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
               (double *)pdVar27[0xb];
          pIVar1 = &x[0xc2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                    .m_rows;
          lVar36 = 0x60;
          uVar35 = 0;
          local_2dc = in_R8D;
          do {
            if ((u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
                + -6 < (long)(uVar35 * 6 + 0xc)) goto LAB_0015eb2f;
            pdVar27 = x[0xc6].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data;
            lVar29 = (x[0xc3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows -
                      x[0xc2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows >> 3) * -0x5555555555555555 +
                     (x[0xc4].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows -
                      (long)x[0xc5].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data >> 3) * -0x5555555555555555 +
                     (((long)pdVar27 -
                       (long)x[0xc4].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data >> 3) + -1 + (ulong)(pdVar27 == (double *)0x0)) * 0x15
            ;
            if (lVar29 == 0) goto LAB_0015ea80;
            uVar28 = *(uint *)&x[0xc1].
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_data;
            if ((uVar35 < uVar28) || (lVar29 + (ulong)uVar28 <= uVar35)) goto LAB_0015ea80;
            pdVar27 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                      m_data;
            puStack_320 = (undefined1 *)0x15ce3e;
            this_01 = (DenseStorage<double,__1,__1,__1,_0> *)
                      std::
                      _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                      ::operator[]((_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
                                    *)pIVar1,(ulong)((int)uVar35 - uVar28));
            if ((this_01->m_rows != 6) || (this_01->m_cols != 1)) {
              puStack_320 = (undefined1 *)0x15ce66;
              Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(this_01,6,6,1);
            }
            if ((this_01->m_rows != 6) || (this_01->m_cols != 1)) {
              pcVar25 = 
              "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>, T1 = double, T2 = double]"
              ;
              goto LAB_0015eb25;
            }
            pdVar26 = this_01->m_data;
            uVar31 = 0xfffffffffffffffe;
            do {
              pdVar9 = (double *)((long)pdVar27 + uVar31 * 8 + lVar36 + 0x10);
              dVar6 = pdVar9[1];
              pdVar26[uVar31 + 2] = *pdVar9;
              (pdVar26 + uVar31 + 2)[1] = dVar6;
              uVar31 = uVar31 + 2;
            } while (uVar31 < 4);
            lVar36 = lVar36 + 0x30;
            bVar37 = uVar35 == 0;
            uVar35 = uVar35 + 1;
          } while (bVar37);
          if (0x1a < (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_rows) {
            pdVar27 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                      m_data;
            dVar6 = pdVar27[0x19];
            x[0xcb].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 = (double *)pdVar27[0x18];
            x[0xcb].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                 = (Index)dVar6;
            x[0xcc].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 = (double *)pdVar27[0x1a];
            if (0x1d < (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                       .m_rows) {
              pdVar27 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data;
              pdVar26 = (double *)pdVar27[0x1c];
              x[0xcc].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows = (Index)pdVar27[0x1b];
              x[0xcd].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data = pdVar26;
              x[0xcd].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows = (Index)pdVar27[0x1d];
              if ((u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows < 0x23) goto LAB_0015eaf7;
              pdVar27 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data;
              pdVar26 = (double *)pdVar27[0x21];
              x[0x5d].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows = (Index)pdVar27[0x20];
              x[0x5e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data = pdVar26;
              x[0x5e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows = (Index)pdVar27[0x22];
              pdVar27 = x[0x116].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data;
              pIVar5 = &x[0x4e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows;
              if (((((double)pdVar27 != (double)*pIVar5) ||
                   (NAN((double)pdVar27) || NAN((double)*pIVar5))) ||
                  (dVar6 = (double)x[0x116].
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows,
                  dVar6 != (double)x[0x4f].
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_data)) ||
                 (NAN(dVar6) ||
                  NAN((double)x[0x4f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                              .m_storage.m_data))) {
LAB_0015cfcc:
                pdVar26 = (double *)
                          x[0x4e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows;
                pdVar9 = x[0x4f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data;
                x[0x116].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data = pdVar26;
                x[0x116].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows = (Index)pdVar9;
                pdVar27 = (double *)
                          x[0x4f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows;
                x[0x117].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data = pdVar27;
                dVar6 = (double)pdVar27 * (double)pdVar27 +
                        (double)pdVar9 * (double)pdVar9 + (double)pdVar26 * (double)pdVar26;
                local_318 = (IndexedMatrixArray *)&DAT_3ff0000000000000;
                if (dVar6 <= 9.999999999999999e-33) {
                  local_2f8._0_16_ = ZEXT816(0);
                  dVar6 = 0.0;
                }
                else {
                  if (dVar6 < 0.0) {
                    puStack_320 = (undefined1 *)0x15d03f;
                    dVar6 = sqrt(dVar6);
                  }
                  else {
                    dVar6 = SQRT(dVar6);
                  }
                  auVar12._8_4_ = SUB84(dVar6,0);
                  auVar12._0_8_ = dVar6;
                  auVar12._12_4_ = (int)((ulong)dVar6 >> 0x20);
                  local_2f8._0_16_ =
                       divpd(*(undefined1 (*) [16])
                              &x[0x4e].
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_rows,auVar12);
                  local_318 = (IndexedMatrixArray *)
                              ((double)x[0x4f].
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       .m_storage.m_rows / dVar6);
                }
                puStack_320 = (undefined1 *)0x15d07a;
                dVar41 = sin(dVar6);
                dVar39 = (double)local_318 * dVar41;
                dVar38 = dVar41 * (double)local_2f8._0_8_;
                auVar10._8_4_ = SUB84(dVar41 * (double)local_2f8._8_8_,0);
                auVar10._0_8_ = dVar38;
                auVar10._12_4_ = (int)((ulong)(dVar41 * (double)local_2f8._8_8_) >> 0x20);
                puStack_320 = (undefined1 *)0x15d0ad;
                dVar6 = cos(dVar6);
                dVar42 = 1.0 - dVar6;
                dVar43 = dVar42 * (double)local_2f8._0_8_;
                dStack_260 = auVar10._8_8_;
                dVar41 = (double)local_318 * dVar42 * (double)local_2f8._8_8_;
                x[0x111].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows = (Index)((double)local_2f8._0_8_ * dVar43 + dVar6);
                x[0x112].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data = (double *)((double)local_2f8._8_8_ * dVar43 + dVar39);
                x[0x112].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows = (Index)((double)local_318 * dVar43 - dStack_260);
                x[0x113].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data = (double *)((double)local_2f8._8_8_ * dVar43 - dVar39);
                x[0x113].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows = (Index)(dVar42 * (double)local_2f8._8_8_ * (double)local_2f8._8_8_ + dVar6)
                ;
                x[0x114].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data = (double *)(dVar41 + dVar38);
                x[0x114].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows = (Index)(dStack_260 + (double)local_318 * dVar43);
                x[0x115].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data = (double *)(dVar41 - dVar38);
                x[0x115].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows = (Index)((double)local_318 * dVar42 * (double)local_318 + dVar6);
              }
              else {
                pdVar27 = x[0x117].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_data;
                pIVar5 = &x[0x4f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows;
                if (((double)pdVar27 != (double)*pIVar5) ||
                   (NAN((double)pdVar27) || NAN((double)*pIVar5))) goto LAB_0015cfcc;
              }
              pdVar27 = x[0x112].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data;
              IVar18 = x[0x112].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows;
              pdVar26 = x[0x113].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data;
              IVar19 = x[0x113].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows;
              pdVar9 = x[0x114].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data;
              IVar20 = x[0x114].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows;
              pdVar40 = x[0x115].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data;
              x[0x54].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows = x[0x111].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows;
              x[0x55].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data = pdVar27;
              x[0x55].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows = IVar18;
              x[0x56].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data = pdVar26;
              x[0x56].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows = IVar19;
              x[0x57].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data = pdVar9;
              x[0x57].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows = IVar20;
              x[0x58].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data = pdVar40;
              x[0x58].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows = x[0x115].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows;
              if (0xe < *(long *)((long)local_308 + 8)) {
                lVar36 = *(long *)local_308;
                local_68.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                m_data.array[0] = *(double *)(lVar36 + 0x48);
                local_68.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                m_data.array[1] = *(double *)(lVar36 + 0x50);
                local_68.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                m_data.array[2] = *(double *)(lVar36 + 0x58);
                local_68.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                m_data.array[3] = *(double *)(lVar36 + 0x60);
                local_68.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                m_data.array[4] = *(double *)(lVar36 + 0x68);
                local_68.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                m_data.array[5] = *(double *)(lVar36 + 0x70);
                puStack_320 = (undefined1 *)0x15d263;
                kine::computeInertiaTensor(&tmp,&local_68,(Matrix3 *)(x + 0xb8));
                if (0x17 < *(long *)((long)local_308 + 8)) {
                  lVar36 = *(long *)local_308;
                  local_98.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                  m_data.array[0] = *(double *)(lVar36 + 0x90);
                  local_98.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                  m_data.array[1] = *(double *)(lVar36 + 0x98);
                  local_98.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                  m_data.array[2] = *(double *)(lVar36 + 0xa0);
                  local_98.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                  m_data.array[3] = *(double *)(lVar36 + 0xa8);
                  local_98.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                  m_data.array[4] = *(double *)(lVar36 + 0xb0);
                  local_98.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                  m_data.array[5] = *(double *)(lVar36 + 0xb8);
                  pIVar5 = &x[0xbc].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows;
                  puStack_320 = (undefined1 *)0x15d2b9;
                  kine::computeInertiaTensor(&tmp,&local_98,(Matrix3 *)pIVar5);
                  uVar35 = CONCAT44(0,*(uint *)((long)&x[0x13].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + 4));
                  local_2f8._0_8_ = uVar35;
                  if (uVar35 != 0) {
                    local_318 = (IndexedMatrixArray *)(x + 0xa2);
                    uVar35 = 0x30;
                    lVar36 = 0;
                    do {
                      uVar28 = (uint)lVar36;
                      uVar31 = (ulong)(uVar28 * 0xc + 0x30);
                      if (*(long *)((long)local_308 + 8) + -3 < (long)uVar31) goto LAB_0015eaf7;
                      lVar29 = *(long *)local_308;
                      tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                      m_data.array._0_16_ = ZEXT816(0);
                      tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                      m_data.array[2] = 0.0;
                      puStack_320 = (undefined1 *)0x15d343;
                      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                                ((DenseStorage<double,__1,__1,__1,_0> *)&tmp,3,3,1);
                      if ((tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[1] != 1.48219693752374e-323) ||
                         (tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                          .m_data.array[2] != 4.94065645841247e-324)) {
                        puStack_320 = (undefined1 *)0x15d36c;
                        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                                  ((DenseStorage<double,__1,__1,__1,_0> *)&tmp,3,3,1);
                      }
                      if ((tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[1] != 1.48219693752374e-323) ||
                         (tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                          .m_data.array[2] != 4.94065645841247e-324)) {
LAB_0015eb10:
                        pcVar25 = 
                        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Block<const Eigen::Matrix<double, -1, 1>, 3, 1>, T1 = double, T2 = double]"
                        ;
                        goto LAB_0015eb25;
                      }
                      puVar3 = (undefined8 *)(lVar29 + uVar31 * 8);
                      uVar17 = puVar3[1];
                      *(undefined8 *)
                       tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                       m_data.array[0] = *puVar3;
                      *(undefined8 *)
                       ((long)tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                              m_storage.m_data.array[0] + 8) = uVar17;
                      lVar30 = 2;
                      do {
                        *(undefined8 *)
                         ((long)tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[0] + lVar30 * 8) =
                             *(undefined8 *)(lVar29 + uVar35 * 8 + lVar30 * 8);
                        lVar30 = lVar30 + 1;
                      } while (lVar30 != 3);
                      puStack_320 = (undefined1 *)0x15d3da;
                      IndexedMatrixArray::setValue(local_318,(Matrix *)&tmp,uVar28);
                      puStack_320 = (undefined1 *)0x15d3e9;
                      free((void *)tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                   m_storage.m_data.array[0]);
                      uVar31 = (ulong)(uVar28 * 0xc + 0x33);
                      if (*(long *)((long)local_308 + 8) + -3 < (long)uVar31) goto LAB_0015eaf7;
                      lVar29 = *(long *)local_308;
                      tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                      m_data.array._0_16_ = ZEXT816(0);
                      tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                      m_data.array[2] = 0.0;
                      puStack_320 = (undefined1 *)0x15d431;
                      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                                ((DenseStorage<double,__1,__1,__1,_0> *)&tmp,3,3,1);
                      if ((tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[1] != 1.48219693752374e-323) ||
                         (tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                          .m_data.array[2] != 4.94065645841247e-324)) {
                        puStack_320 = (undefined1 *)0x15d45a;
                        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                                  ((DenseStorage<double,__1,__1,__1,_0> *)&tmp,3,3,1);
                      }
                      if ((tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[1] != 1.48219693752374e-323) ||
                         (tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                          .m_data.array[2] != 4.94065645841247e-324)) goto LAB_0015eb10;
                      puVar3 = (undefined8 *)(lVar29 + uVar31 * 8);
                      uVar17 = puVar3[1];
                      *(undefined8 *)
                       tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                       m_data.array[0] = *puVar3;
                      *(undefined8 *)
                       ((long)tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                              m_storage.m_data.array[0] + 8) = uVar17;
                      lVar30 = 0;
                      do {
                        *(undefined8 *)
                         ((long)tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[0] + 0x10 + lVar30 * 8) =
                             *(undefined8 *)(uVar35 * 8 + 0x28 + lVar29 + lVar30 * 8);
                        lVar30 = lVar30 + 1;
                      } while (lVar30 != 1);
                      puStack_320 = (undefined1 *)0x15d4d1;
                      IndexedMatrixArray::setValue
                                ((IndexedMatrixArray *)
                                 &x[0xa7].
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows,(Matrix *)&tmp,uVar28);
                      puStack_320 = (undefined1 *)0x15d4db;
                      free((void *)tmp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                   m_storage.m_data.array[0]);
                      lVar36 = lVar36 + 1;
                      uVar35 = (ulong)((int)uVar35 + 0xc);
                    } while (lVar36 != local_2f8._0_8_);
                  }
                  if (2 < *(long *)((long)local_308 + 8)) {
                    pdVar27 = *(double **)local_308;
                    dVar41 = *pdVar27;
                    pdVar26 = (double *)pdVar27[1];
                    x[0x8e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                    .m_rows = (Index)dVar41;
                    x[0x8f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                    .m_data = pdVar26;
                    dVar6 = pdVar27[2];
                    x[0x8f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                    .m_rows = (Index)dVar6;
                    if (*(char *)((long)&x[0x43].
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                         .m_storage.m_rows + 5) != '\0') {
                      dVar38 = (double)x[0x53].
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       .m_storage.m_rows;
                      x[0x8e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows =
                           (Index)(dVar41 - (double)x[0x53].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data);
                      x[0x8f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data = (double *)((double)pdVar26 - dVar38);
                      x[0x8f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows =
                           (Index)(dVar6 - (double)x[0x54].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data);
                    }
                    if (5 < *(long *)((long)local_308 + 8)) {
                      lVar36 = *(long *)local_308;
                      IVar18 = *(Index *)(lVar36 + 0x20);
                      x[0x90].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data = *(double **)(lVar36 + 0x18);
                      x[0x90].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows = IVar18;
                      x[0x91].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data = *(double **)(lVar36 + 0x28);
                      if (8 < *(long *)((long)local_308 + 8)) {
                        lVar36 = *(long *)local_308;
                        pdVar27 = *(double **)(lVar36 + 0x38);
                        x[0x91].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows = *(Index *)(lVar36 + 0x30);
                        x[0x92].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data = pdVar27;
                        x[0x92].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows = *(Index *)(lVar36 + 0x40);
                        if (0x11 < *(long *)((long)local_308 + 8)) {
                          lVar36 = *(long *)local_308;
                          IVar18 = *(Index *)(lVar36 + 0x80);
                          x[0x93].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_data = *(double **)(lVar36 + 0x78);
                          x[0x93].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows = IVar18;
                          x[0x94].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_data = *(double **)(lVar36 + 0x88);
                          if (0x1a < *(long *)((long)local_308 + 8)) {
                            lVar36 = *(long *)local_308;
                            pdVar27 = *(double **)(lVar36 + 200);
                            x[0x94].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows = *(Index *)(lVar36 + 0xc0);
                            x[0x95].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data = pdVar27;
                            x[0x95].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows = *(Index *)(lVar36 + 0xd0);
                            if (0x1d < *(long *)((long)local_308 + 8)) {
                              lVar36 = *(long *)local_308;
                              IVar18 = *(Index *)(lVar36 + 0xe0);
                              x[0x96].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                              .m_storage.m_data = *(double **)(lVar36 + 0xd8);
                              x[0x96].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                              .m_storage.m_rows = IVar18;
                              x[0x97].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                              .m_storage.m_data = *(double **)(lVar36 + 0xe8);
                              if (0x23 < *(long *)((long)local_308 + 8)) {
                                lVar36 = *(long *)local_308;
                                pdVar27 = *(double **)(lVar36 + 0x110);
                                x[0x97].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows = *(Index *)(lVar36 + 0x108);
                                x[0x98].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_data = pdVar27;
                                x[0x98].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows = *(Index *)(lVar36 + 0x118);
                                if (0x29 < *(long *)((long)local_308 + 8)) {
                                  lVar36 = *(long *)local_308;
                                  IVar18 = *(Index *)(lVar36 + 0x140);
                                  x[0x99].
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data = *(double **)(lVar36 + 0x138);
                                  x[0x99].
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows = IVar18;
                                  x[0x9a].
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data = *(double **)(lVar36 + 0x148);
                                  if (0x20 < *(long *)((long)local_308 + 8)) {
                                    lVar36 = *(long *)local_308;
                                    pdVar27 = *(double **)(lVar36 + 0xf8);
                                    x[0x9a].
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                    m_storage.m_rows = *(Index *)(lVar36 + 0xf0);
                                    x[0x9b].
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                    m_storage.m_data = pdVar27;
                                    pdVar27 = *(double **)(lVar36 + 0x100);
                                    x[0x9b].
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                    m_storage.m_rows = (Index)pdVar27;
                                    if (0x26 < *(long *)((long)local_308 + 8)) {
                                      lVar36 = *(long *)local_308;
                                      IVar18 = *(Index *)(lVar36 + 0x128);
                                      x[0x9c].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_data = *(double **)(lVar36 + 0x120);
                                      x[0x9c].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_rows = IVar18;
                                      x[0x9d].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_data = *(double **)(lVar36 + 0x130);
                                      pdVar26 = x[0x11c].
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                .m_storage.m_data;
                                      pIVar2 = &x[0x9a].
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                .m_storage.m_rows;
                                      if (((((double)pdVar26 != (double)*pIVar2) ||
                                           (NAN((double)pdVar26) || NAN((double)*pIVar2))) ||
                                          (dVar6 = (double)x[0x11c].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows,
                                          dVar6 != (double)x[0x9b].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data)) ||
                                         (NAN(dVar6) ||
                                          NAN((double)x[0x9b].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data))) {
LAB_0015d700:
                                        pdVar26 = (double *)
                                                  x[0x9a].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                        pdVar9 = x[0x9b].
                                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                 .m_storage.m_data;
                                        x[0x11c].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_data = pdVar26;
                                        x[0x11c].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_rows = (Index)pdVar9;
                                        x[0x11d].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_data = pdVar27;
                                        dVar6 = (double)pdVar27 * (double)pdVar27 +
                                                (double)pdVar9 * (double)pdVar9 +
                                                (double)pdVar26 * (double)pdVar26;
                                        dVar41 = 1.0;
                                        if (dVar6 <= 9.999999999999999e-33) {
                                          local_2f8._0_16_ = ZEXT816(0);
                                          dVar6 = 0.0;
                                        }
                                        else {
                                          if (dVar6 < 0.0) {
                                            puStack_320 = (undefined1 *)0x15d79e;
                                            dVar6 = sqrt(dVar6);
                                          }
                                          else {
                                            dVar6 = SQRT(dVar6);
                                          }
                                          auVar13._8_4_ = SUB84(dVar6,0);
                                          auVar13._0_8_ = dVar6;
                                          auVar13._12_4_ = (int)((ulong)dVar6 >> 0x20);
                                          local_2f8._0_16_ =
                                               divpd(*(undefined1 (*) [16])
                                                      &x[0x9a].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows,auVar13);
                                          dVar41 = (double)x[0x9b].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows / dVar6;
                                        }
                                        puStack_320 = (undefined1 *)0x15d7d9;
                                        local_318 = (IndexedMatrixArray *)dVar41;
                                        dVar41 = sin(dVar6);
                                        dVar39 = (double)local_318 * dVar41;
                                        dVar38 = dVar41 * (double)local_2f8._0_8_;
                                        auVar11._8_4_ = SUB84(dVar41 * (double)local_2f8._8_8_,0);
                                        auVar11._0_8_ = dVar38;
                                        auVar11._12_4_ =
                                             (int)((ulong)(dVar41 * (double)local_2f8._8_8_) >> 0x20
                                                  );
                                        puStack_320 = (undefined1 *)0x15d80c;
                                        dVar6 = cos(dVar6);
                                        dVar42 = 1.0 - dVar6;
                                        dVar43 = dVar42 * (double)local_2f8._0_8_;
                                        dStack_260 = auVar11._8_8_;
                                        dVar41 = (double)local_318 *
                                                 dVar42 * (double)local_2f8._8_8_;
                                        x[0x117].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_rows =
                                             (Index)((double)local_2f8._0_8_ * dVar43 + dVar6);
                                        x[0x118].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_data =
                                             (double *)((double)local_2f8._8_8_ * dVar43 + dVar39);
                                        x[0x118].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_rows =
                                             (Index)((double)local_318 * dVar43 - dStack_260);
                                        x[0x119].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_data =
                                             (double *)((double)local_2f8._8_8_ * dVar43 - dVar39);
                                        x[0x119].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_rows =
                                             (Index)(dVar42 * (double)local_2f8._8_8_ *
                                                     (double)local_2f8._8_8_ + dVar6);
                                        x[0x11a].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_data = (double *)(dVar41 + dVar38);
                                        x[0x11a].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_rows =
                                             (Index)(dStack_260 + (double)local_318 * dVar43);
                                        x[0x11b].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_data = (double *)(dVar41 - dVar38);
                                        x[0x11b].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_rows =
                                             (Index)((double)local_318 * dVar42 * (double)local_318
                                                    + dVar6);
                                      }
                                      else {
                                        pdVar26 = x[0x11d].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                        if (((double)pdVar26 != (double)pdVar27) ||
                                           (NAN((double)pdVar26) || NAN((double)pdVar27)))
                                        goto LAB_0015d700;
                                      }
                                      pIVar2 = &x[0x54].
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                .m_storage.m_rows;
                                      local_2f8._0_8_ = x + 0x96;
                                      local_318 = (IndexedMatrixArray *)
                                                  &x[0x97].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                      pdVar27 = x[0x118].
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                .m_storage.m_data;
                                      IVar18 = x[0x118].
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                               .m_storage.m_rows;
                                      pdVar26 = x[0x119].
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                .m_storage.m_data;
                                      IVar19 = x[0x119].
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                               .m_storage.m_rows;
                                      pdVar9 = x[0x11a].
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                               .m_storage.m_data;
                                      IVar20 = x[0x11a].
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                               .m_storage.m_rows;
                                      pdVar40 = x[0x11b].
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                .m_storage.m_data;
                                      x[0x9d].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_rows =
                                           x[0x117].
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                           .m_storage.m_rows;
                                      x[0x9e].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_data = pdVar27;
                                      x[0x9e].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_rows = IVar18;
                                      x[0x9f].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_data = pdVar26;
                                      x[0x9f].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_rows = IVar19;
                                      x[0xa0].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_data = pdVar9;
                                      x[0xa0].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_rows = IVar20;
                                      x[0xa1].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_data = pdVar40;
                                      x[0xa1].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_rows =
                                           x[0x11b].
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                           .m_storage.m_rows;
                                      dVar38 = (double)x[0x54].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                      pdVar26 = x[0x55].
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                .m_storage.m_data;
                                      pdVar9 = x[0x56].
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                               .m_storage.m_data;
                                      dVar39 = (double)x[0x56].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                      dVar42 = (double)x[0x57].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                      pdVar40 = x[0x58].
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                .m_storage.m_data;
                                      dVar6 = (double)x[0x55].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                      pdVar27 = x[0x57].
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                .m_storage.m_data;
                                      dVar41 = (double)x[0x58].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                      lVar36 = 0x9e8;
                                      do {
                                        dVar43 = *(double *)
                                                  ((long)&x[-1].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + lVar36);
                                        dVar7 = *(double *)((long)x + lVar36 + -8);
                                        dVar8 = *(double *)
                                                 ((long)&(x->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_data + lVar36);
                                        *(double *)((long)adStack_cc0 + lVar36) =
                                             dVar8 * dVar42 +
                                             dVar7 * (double)pdVar9 + dVar43 * dVar38;
                                        *(double *)((long)adStack_cc0 + lVar36 + 8) =
                                             dVar8 * (double)pdVar40 +
                                             dVar7 * dVar39 + dVar43 * (double)pdVar26;
                                        *(double *)((long)adStack_cc0 + lVar36 + 0x10) =
                                             dVar8 * dVar41 + (double)pdVar27 * dVar7 +
                                             dVar6 * dVar43;
                                        lVar36 = lVar36 + 0x18;
                                      } while (lVar36 != 0xa30);
                                      x[0x86].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_data =
                                           (double *)
                                           tmp.
                                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                           .m_storage.m_data.array[0];
                                      x[0x86].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_rows =
                                           (Index)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[1];
                                      x[0x87].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_data =
                                           (double *)
                                           tmp.
                                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                           .m_storage.m_data.array[2];
                                      x[0x87].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_rows =
                                           (Index)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[3];
                                      x[0x88].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_data =
                                           (double *)
                                           tmp.
                                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                           .m_storage.m_data.array[4];
                                      x[0x88].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_rows =
                                           (Index)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[5];
                                      x[0x89].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_data =
                                           (double *)
                                           tmp.
                                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                           .m_storage.m_data.array[6];
                                      x[0x89].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_rows =
                                           (Index)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[7];
                                      x[0x8a].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_data =
                                           (double *)
                                           tmp.
                                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                           .m_storage.m_data.array[8];
                                      lVar36 = 0;
                                      uVar35 = 0;
                                      do {
                                        pdVar27 = x[0xc6].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                        lVar29 = (x[0xc3].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows -
                                                  x[0xc2].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows >> 3) * -0x5555555555555555 +
                                                 (x[0xc4].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows -
                                                  (long)x[0xc5].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data >> 3) * -0x5555555555555555 +
                                                 (((long)pdVar27 -
                                                   (long)x[0xc4].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data >> 3) + -1 +
                                                 (ulong)(pdVar27 == (double *)0x0)) * 0x15;
                                        if (lVar29 == 0) {
LAB_0015ea80:
                                          puStack_320 = (undefined1 *)0x15ea9f;
                                          __assert_fail(
                                                  "checkIndex(time) && \"Error: Time out of range\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                                                  ,0x9b,
                                                  "void stateObservation::IndexedMatrixArray::check_(unsigned int) const"
                                                  );
                                        }
                                        uVar28 = *(uint *)&x[0xc1].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                        if ((uVar35 < uVar28) || (lVar29 + (ulong)uVar28 <= uVar35))
                                        goto LAB_0015ea80;
                                        puStack_320 = (undefined1 *)0x15db7e;
                                        pMVar23 = std::
                                                  _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                                                  ::operator[]((
                                                  _Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
                                                  *)pIVar1,(ulong)((int)uVar35 - uVar28));
                                        if (((pMVar23->
                                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                             ).m_storage.m_rows < 3) ||
                                           ((pMVar23->
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                            ).m_storage.m_cols < 1)) {
LAB_0015eabd:
                                          puStack_320 = (undefined1 *)0x15eadc;
                                          __assert_fail(
                                                  "startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                                                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85
                                                  ,
                                                  "Eigen::Block<Eigen::Matrix<double, -1, -1>, 3, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
                                                  );
                                        }
                                        if ((long)x[0x15].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + -3 < lVar36)
                                        goto LAB_0015eade;
                                        pdVar26 = (pMVar23->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  ).m_storage.m_data;
                                        lVar29 = x[0x14].
                                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                 .m_storage.m_rows;
                                        dVar6 = pdVar26[1];
                                        pdVar27 = (double *)(lVar29 + lVar36 * 8);
                                        *pdVar27 = *pdVar26;
                                        pdVar27[1] = dVar6;
                                        *(double *)(lVar29 + 0x10 + lVar36 * 8) = pdVar26[2];
                                        pdVar27 = x[0xc6].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                        lVar29 = (x[0xc3].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows -
                                                  x[0xc2].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows >> 3) * -0x5555555555555555 +
                                                 (x[0xc4].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows -
                                                  (long)x[0xc5].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data >> 3) * -0x5555555555555555 +
                                                 (((long)pdVar27 -
                                                   (long)x[0xc4].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data >> 3) + -1 +
                                                 (ulong)(pdVar27 == (double *)0x0)) * 0x15;
                                        if (lVar29 == 0) goto LAB_0015ea80;
                                        uVar28 = *(uint *)&x[0xc1].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                        if ((uVar35 < uVar28) || (lVar29 + (ulong)uVar28 <= uVar35))
                                        goto LAB_0015ea80;
                                        puStack_320 = (undefined1 *)0x15dc4b;
                                        pMVar23 = std::
                                                  _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                                                  ::operator[]((
                                                  _Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
                                                  *)pIVar1,(ulong)((int)uVar35 - uVar28));
                                        if (((pMVar23->
                                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                             ).m_storage.m_rows < 6) ||
                                           ((pMVar23->
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                            ).m_storage.m_cols < 1)) goto LAB_0015eabd;
                                        if ((long)x[0x16].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + -3 < lVar36)
                                        goto LAB_0015eade;
                                        pdVar26 = (pMVar23->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  ).m_storage.m_data;
                                        lVar29 = x[0x15].
                                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                 .m_storage.m_rows;
                                        dVar6 = pdVar26[4];
                                        pdVar27 = (double *)(lVar29 + lVar36 * 8);
                                        *pdVar27 = pdVar26[3];
                                        pdVar27[1] = dVar6;
                                        *(double *)(lVar29 + 0x10 + lVar36 * 8) = pdVar26[5];
                                        uVar35 = uVar35 + 1;
                                        lVar36 = lVar36 + 3;
                                      } while (uVar35 == 1);
                                      if (0x2c < *(long *)((long)local_308 + 8)) {
                                        lVar36 = *(long *)local_308;
                                        pdVar27 = *(double **)(lVar36 + 0x158);
                                        x[0xf0].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_rows = *(Index *)(lVar36 + 0x150);
                                        x[0xf1].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_data = pdVar27;
                                        x[0xf1].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_rows = *(Index *)(lVar36 + 0x160);
                                        if (0x2f < *(long *)((long)local_308 + 8)) {
                                          pIStack_330 = &x[0xf0].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                          lVar36 = *(long *)local_308;
                                          pVStack_328 = x + 0xf2;
                                          IVar18 = *(Index *)(lVar36 + 0x170);
                                          x[0xf2].
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_data = *(double **)(lVar36 + 0x168);
                                          x[0xf2].
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_rows = IVar18;
                                          x[0xf3].
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_data = *(double **)(lVar36 + 0x178);
                                          pVStack_398 = x + 0xa2;
                                          pIStack_390 = &x[0xa7].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                          pVStack_378 = x + 0xce;
                                          pIStack_358 = &x[0xcf].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                          pIStack_350 = &x[0x14].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                          pIStack_348 = &x[0x15].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                          pIStack_380 = local_1c8;
                                          pVStack_388 = local_1c0;
                                          uStack_3b0 = 0x15ddd4;
                                          pMStack_3a8 = (Matrix3 *)(x + 0xb8);
                                          pIStack_3a0 = pIVar5;
                                          pIStack_370 = &x[0x4e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                          pIStack_368 = pIVar2;
                                          pVStack_360 = x + 0x50;
                                          pVStack_340 = x + 0xcb;
                                          pIStack_338 = &x[0xcc].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                          local_308 = pVStack_398;
                                          (*(code *)(x->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_data[10])
                                                    (x,&x[0x8e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows,x + 0x90,
                                                  &x[0x91].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows,x + 0x93,
                                                  &x[0x94].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows);
                                          uVar28 = local_2dc;
                                          auVar12 = _DAT_00166020;
                                          pdStack_1b0 = x[0x51].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                          uVar35 = (ulong)DAT_00166020;
                                          local_190 = x[0x50].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                          local_188 = (double)x[0x50].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                          dStack_180 = (double)((ulong)local_190 ^ uVar35);
                                          lVar36 = 0;
                                          do {
                                            dVar6 = *(double *)
                                                     ((long)&x[0x54].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + lVar36);
                                            dVar41 = *(double *)
                                                      ((long)&x[0x55].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + lVar36);
                                            dVar38 = *(double *)
                                                      ((long)&x[0x55].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + lVar36);
                                            *(double *)
                                             ((long)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array + lVar36) =
                                                 dVar38 * (local_188 + local_188) +
                                                 dVar41 * (double)pdStack_1b0 * -2.0 + dVar6 * 0.0;
                                            *(double *)
                                             ((long)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array + lVar36 + 8) =
                                                 dVar38 * (dStack_180 + dStack_180) +
                                                 dVar41 * 0.0 +
                                                 dVar6 * ((double)pdStack_1b0 + (double)pdStack_1b0)
                                            ;
                                            *(double *)
                                             ((long)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array + lVar36 + 0x10) =
                                                 (dVar38 * 0.0 +
                                                 ((double)local_190 + (double)local_190) * dVar41) -
                                                 (local_188 + local_188) * dVar6;
                                            lVar36 = lVar36 + 0x18;
                                          } while (lVar36 != 0x48);
                                          dVar6 = (double)x[0x97].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                          pdVar27 = x[0x98].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                          dVar41 = (double)x[0x98].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                          local_308 = (Vector *)
                                                      x[0x54].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                          pdStack_300 = x[0x55].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                          pdVar26 = x[0x99].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                          dVar38 = (double)x[0x99].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                          pdVar9 = x[0x9a].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                          dVar39 = (double)pdVar9 *
                                                   (double)x[0x57].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows +
                                                  dVar38 * (double)x[0x56].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data +
                                                  (double)pdVar26 * (double)local_308 +
                                                  (double)x[0xce].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data +
                                                  dVar41 * tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[6] +
                                                  (double)pdVar27 *
                                                  tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[3] +
                                                  dVar6 * tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[0];
                                          pdVar40 = (double *)
                                                    ((double)pdVar9 *
                                                     (double)x[0x58].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data +
                                                  dVar38 * (double)x[0x56].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows +
                                                  (double)pdVar26 * (double)pdStack_300 +
                                                  (double)x[0xce].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows +
                                                  dVar41 * tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[7] +
                                                  (double)pdVar27 *
                                                  tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[4] +
                                                  dVar6 * tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[1]);
                                          dVar38 = (double)pdVar9 *
                                                   (double)x[0x58].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows +
                                                  dVar38 * (double)x[0x57].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data +
                                                  (double)pdVar26 *
                                                  (double)x[0x55].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows +
                                                  (double)x[0xcf].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data +
                                                  dVar41 * tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[8] +
                                                  (double)pdVar27 *
                                                  tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[5] +
                                                  dVar6 * tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[2];
                                          x[0x8a].
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_rows = (Index)dVar39;
                                          x[0x8b].
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_data = pdVar40;
                                          x[0x8b].
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_rows = (Index)dVar38;
                                          local_318 = (IndexedMatrixArray *)
                                                      x[0xd0].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                          uStack_310 = 0;
                                          dVar6 = (double)x[0xcf].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                          dVar41 = (double)(uVar35 ^ (ulong)x[0xd0].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data);
                                          uVar31 = auVar12._8_8_ ^
                                                   x[0xd0].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                          auVar14._8_4_ = (int)uVar31;
                                          auVar14._0_8_ = dVar41;
                                          auVar14._12_4_ = (int)(uVar31 >> 0x20);
                                          pdVar27 = x[0xd0].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                          local_1b8 = 0.0;
                                          local_1a8 = (ulong)local_188 ^ uVar35;
                                          local_1a0 = (double)((ulong)pdStack_1b0 ^ uVar35);
                                          uStack_198 = 0;
                                          local_178 = 0;
                                          lVar36 = 0x10;
                                          do {
                                            dVar42 = *(double *)((long)&local_1c8 + lVar36);
                                            dVar43 = *(double *)((long)&local_1c0 + lVar36);
                                            dVar7 = *(double *)((long)&local_1b8 + lVar36);
                                            *(double *)((long)local_168 + lVar36) =
                                                 dVar7 * local_188 +
                                                 dVar43 * (double)((ulong)pdStack_1b0 ^ uVar35) +
                                                 dVar42 * 0.0;
                                            *(double *)((long)local_168 + lVar36 + 8) =
                                                 dVar7 * dStack_180 +
                                                 dVar43 * 0.0 + dVar42 * (double)pdStack_1b0;
                                            *(double *)((long)&local_158 + lVar36) =
                                                 (dVar7 * 0.0 + (double)local_190 * dVar43) -
                                                 dVar42 * local_188;
                                            lVar36 = lVar36 + 0x18;
                                          } while (lVar36 != 0x58);
                                          dStack_150 = (double)local_318 + dStack_150;
                                          dStack_240 = auVar14._8_8_;
                                          tmp.
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                          .m_storage.m_data.array[2] = dVar41 + local_148;
                                          tmp.
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                          .m_storage.m_data.array[3] = dStack_240 + dStack_140;
                                          tmp.
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                          .m_storage.m_data.array[1]._0_4_ = SUB84(dStack_150,0);
                                          tmp.
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                          .m_storage.m_data.array[0] = local_158 + 0.0;
                                          tmp.
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                          .m_storage.m_data.array[1]._4_4_ =
                                               (int)((ulong)dStack_150 >> 0x20);
                                          dStack_130 = dVar6 + dStack_130;
                                          tmp.
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                          .m_storage.m_data.array[5]._0_4_ = SUB84(dStack_130,0);
                                          tmp.
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                          .m_storage.m_data.array[4] = local_138 + 0.0;
                                          tmp.
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                          .m_storage.m_data.array[5]._4_4_ =
                                               (int)((ulong)dStack_130 >> 0x20);
                                          tmp.
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                          .m_storage.m_data.array[6] = (double)pdVar27 + local_128;
                                          tmp.
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                          .m_storage.m_data.array[7] =
                                               (double)((ulong)dVar6 ^ uVar35) + dStack_120;
                                          tmp.
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                          .m_storage.m_data.array[8] = local_118 + 0.0;
                                          lVar36 = 0;
                                          do {
                                            dVar6 = *(double *)
                                                     ((long)&x[0x54].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + lVar36);
                                            dVar41 = *(double *)
                                                      ((long)&x[0x55].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + lVar36);
                                            dVar42 = *(double *)
                                                      ((long)&x[0x55].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + lVar36);
                                            *(double *)((long)&local_108 + lVar36) =
                                                 dVar42 * tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[6] +
                                                 dVar41 * tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[3] +
                                                 dVar6 * (local_158 + 0.0);
                                            *(double *)((long)adStack_100 + lVar36) =
                                                 dVar42 * tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[7] +
                                                 dVar41 * (local_138 + 0.0) + dVar6 * dStack_150;
                                            *(double *)((long)adStack_100 + lVar36 + 8) =
                                                 dVar42 * tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[8] +
                                                 tmp.
                                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                 .m_storage.m_data.array[5] * dVar41 +
                                                 tmp.
                                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                 .m_storage.m_data.array[2] * dVar6;
                                            lVar36 = lVar36 + 0x18;
                                          } while (lVar36 != 0x48);
                                          local_b8 = &local_108;
                                          local_c0 = local_2f8._0_8_;
                                          local_b0 = local_2f8._0_8_;
                                          local_a8 = 3;
                                          pdVar27 = x[0x96].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                          dVar6 = (double)x[0x96].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                          pdVar26 = x[0x97].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                          x[0x8a].
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_rows =
                                               (Index)(dVar39 + (double)pdVar26 * local_d8 +
                                                                dVar6 * adStack_100[2] +
                                                                (double)pdVar27 * local_108);
                                          x[0x8b].
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_data =
                                               (double *)
                                               ((double)pdVar40 +
                                               (double)pdVar26 * dStack_d0 +
                                               dVar6 * adStack_100[3] +
                                               (double)pdVar27 * adStack_100[0]);
                                          x[0x8b].
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_rows =
                                               (Index)(dVar38 + (double)pdVar26 * local_c8 +
                                                                dVar6 * adStack_100[4] +
                                                                (double)pdVar27 * adStack_100[1]);
                                          pdVar27 = x[0x9c].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                          dVar6 = (double)x[0x9c].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                          dVar42 = (double)x[0x56].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                          pdVar16 = x[0x58].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                          pdVar26 = x[0x9d].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                          dVar39 = (double)x[0x50].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                          dVar41 = (double)x[0x55].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                          pdVar9 = x[0x57].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                          dVar38 = (double)x[0x58].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                          pdVar40 = x[0x51].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                          x[0x8c].
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_data =
                                               (double *)
                                               ((double)pdVar26 *
                                                (double)x[0x57].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows +
                                                dVar6 * (double)x[0x56].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data +
                                                (double)local_308 * (double)pdVar27 +
                                               (double)x[0x50].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data);
                                          x[0x8c].
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_rows =
                                               (Index)((double)pdVar26 * (double)pdVar16 +
                                                       dVar6 * dVar42 +
                                                       (double)pdStack_300 * (double)pdVar27 +
                                                      dVar39);
                                          x[0x8d].
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_data =
                                               (double *)
                                               ((double)pdVar26 * dVar38 + dVar6 * (double)pdVar9 +
                                                (double)pdVar27 * dVar41 + (double)pdVar40);
                                          pIVar1 = &x[0x8d].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                          this_00 = (AlgebraicSensor *)(x + 1);
                                          puStack_320 = (undefined1 *)0x15e434;
                                          uVar22 = AlgebraicSensor::getStateSize(this_00);
                                          puStack_320 = (undefined1 *)0x15e446;
                                          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                                                    ((DenseStorage<double,__1,__1,_1,_0> *)pIVar1,
                                                     (ulong)uVar22,(ulong)uVar22,1);
                                          if ((long)x[0x8e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data < 9) {
                                            pcVar25 = 
                                            "Eigen::Block<Eigen::Matrix<double, -1, 1>, 9, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = 9, BlockCols = 1, InnerPanel = false]"
                                            ;
                                          }
                                          else {
                                            puVar3 = (undefined8 *)
                                                     x[0x8d].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                            IVar18 = x[0x86].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                            *puVar3 = x[0x86].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                            puVar3[1] = IVar18;
                                            IVar18 = x[0x87].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                            puVar3[2] = x[0x87].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                            puVar3[3] = IVar18;
                                            IVar18 = x[0x88].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                            puVar3[4] = x[0x88].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                            puVar3[5] = IVar18;
                                            IVar18 = x[0x89].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                            puVar3[6] = x[0x89].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                            puVar3[7] = IVar18;
                                            puVar3[8] = x[0x8a].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                            if (0xb < (long)x[0x8e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data) {
                                              lVar36 = x[0x8d].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                              pdVar27 = x[0x8b].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                              *(Index *)(lVar36 + 0x48) =
                                                   x[0x8a].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                              *(double **)(lVar36 + 0x50) = pdVar27;
                                              *(Index *)(lVar36 + 0x58) =
                                                   x[0x8b].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                              if (0xe < (long)x[0x8e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data) {
                                                lVar36 = x[0x8d].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                IVar18 = x[0x8c].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                *(double **)(lVar36 + 0x60) =
                                                     x[0x8c].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                *(Index *)(lVar36 + 0x68) = IVar18;
                                                *(double **)(lVar36 + 0x70) =
                                                     x[0x8d].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                *(undefined4 *)
                                                 &x[0x46].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data = 0xf;
                                                if ((*(char *)((long)&x[0x43].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + 4) == '\x01') &&
                                                  (*(int *)((long)&x[0x13].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + 4) != 0)) {
                                                  uVar22 = 0xc;
                                                  uVar35 = 0;
                                                  do {
                                                    if ((u->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_rows + -6 <
                                                  (long)(ulong)((int)uVar35 * 6 + 0xc))
                                                  goto LAB_0015eb2f;
                                                  uVar31 = (ulong)*(uint *)&x[0x46].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                  if ((long)x[0x8e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + -6 < (long)uVar31) {
                                                    pcVar25 = 
                                                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                                                  ;
                                                  goto LAB_0015eb5b;
                                                  }
                                                  uVar32 = (ulong)(uVar22 >> 1);
                                                  uVar31 = uVar31 * 8 +
                                                           x[0x8d].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                  pdVar27 = (u->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_data;
                                                  uVar33 = (ulong)((uint)(uVar31 >> 3) & 1);
                                                  if ((uVar31 & 7) != 0) {
                                                    uVar33 = 6;
                                                  }
                                                  if (uVar33 != 0) {
                                                    uVar34 = 0;
                                                    do {
                                                      *(double *)(uVar31 + uVar34 * 8) =
                                                           pdVar27[uVar32 * 2 + uVar34];
                                                      uVar34 = uVar34 + 1;
                                                    } while (uVar33 != uVar34);
                                                  }
                                                  uVar34 = (6U - (int)uVar33 & 6) + uVar33;
                                                  if ((uVar31 & 7) == 0) {
                                                    do {
                                                      dVar6 = (pdVar27 + uVar32 * 2 + uVar33)[1];
                                                      pdVar26 = (double *)(uVar31 + uVar33 * 8);
                                                      *pdVar26 = pdVar27[uVar32 * 2 + uVar33];
                                                      pdVar26[1] = dVar6;
                                                      uVar33 = uVar33 + 2;
                                                    } while (uVar33 < uVar34);
                                                  }
                                                  if ((uint)uVar34 < 6) {
                                                    do {
                                                      *(double *)(uVar31 + uVar34 * 8) =
                                                           pdVar27[uVar32 * 2 + uVar34];
                                                      uVar34 = uVar34 + 1;
                                                    } while (uVar34 != 6);
                                                  }
                                                  *(int *)&x[0x46].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data =
                                                       *(int *)&x[0x46].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + 6;
                                                  uVar35 = uVar35 + 1;
                                                  uVar22 = uVar22 + 6;
                                                  } while (uVar35 < *(uint *)((long)&x[0x13].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + 4));
                                                }
                                                if (*(char *)((long)&x[0x43].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + 6) != '\x01') {
LAB_0015e9fc:
                                                  puStack_320 = (undefined1 *)0x15ea09;
                                                  AlgebraicSensor::setState
                                                            (this_00,(Vector *)pIVar1,uVar28);
                                                  puStack_320 = (undefined1 *)0x15ea1e;
                                                  AlgebraicSensor::getMeasurements
                                                            ((AlgebraicSensor *)&tmp,
                                                             SUB81(this_00,0));
                                                  __ptr = (void *)x[0x1b].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                  x[0x1b].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows =
                                                       (Index)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[0];
                                                  pdVar27 = x[0x1c].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                  x[0x1c].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data =
                                                       (double *)
                                                       tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[1];
                                                  tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[1] = (double)pdVar27;
                                                  tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[0] = (double)__ptr;
                                                  puStack_320 = (undefined1 *)0x15ea54;
                                                  free(__ptr);
                                                  puStack_320 = (undefined1 *)0x15ea67;
                                                  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::
                                                  DenseStorage((DenseStorage<double,__1,__1,_1,_0> *
                                                               )this,(
                                                  DenseStorage<double,__1,__1,_1,_0> *)
                                                  &x[0x1b].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows);
                                                  VVar44.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows = extraout_RDX;
                                                  VVar44.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data = (double *)this;
                                                  return (Vector)VVar44.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage;
                                                }
                                                puStack_320 = (undefined1 *)0x15e633;
                                                pdVar27 = (double *)
                                                          cos((double)x[0x5e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows);
                                                x[0x65].
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                .m_storage.m_data = pdVar27;
                                                puStack_320 = (undefined1 *)0x15e64a;
                                                local_108 = sin((double)x[0x5e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows);
                                                x[0x65].
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                .m_storage.m_rows = (Index)local_108;
                                                tmp.
                                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                .m_storage.m_data.array[1] = 0.0;
                                                tmp.
                                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                .m_storage.m_data.array[0] =
                                                     (double)&x[0x60].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                tmp.
                                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                .m_storage.m_data.array[2] = 4.94065645841247e-324;
                                                tmp.
                                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                .m_storage.m_data.array[3] = 4.94065645841247e-324;
                                                x[0x60].
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                .m_storage.m_rows =
                                                     (Index)x[0x65].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                local_108 = -local_108;
                                                puStack_320 = (undefined1 *)0x15e6a2;
                                                pCVar24 = Eigen::
                                                  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  ::operator_((
                                                  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  *)&tmp,&local_108);
                                                local_158 = 0.0;
                                                puStack_320 = (undefined1 *)0x15e6b9;
                                                pCVar24 = Eigen::
                                                  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  ::operator_(pCVar24,&local_158);
                                                puStack_320 = (undefined1 *)0x15e6c8;
                                                pCVar24 = Eigen::
                                                  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  ::operator_(pCVar24,(Scalar *)
                                                                      &x[0x65].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows);
                                                puStack_320 = (undefined1 *)0x15e6d7;
                                                pCVar24 = Eigen::
                                                  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  ::operator_(pCVar24,(Scalar *)(x + 0x65));
                                                local_1b8 = 0.0;
                                                puStack_320 = (undefined1 *)0x15e6ee;
                                                pCVar24 = Eigen::
                                                  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  ::operator_(pCVar24,&local_1b8);
                                                local_168[1] = 0.0;
                                                puStack_320 = (undefined1 *)0x15e705;
                                                pCVar24 = Eigen::
                                                  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  ::operator_(pCVar24,local_168 + 1);
                                                local_168[0] = 0.0;
                                                puStack_320 = (undefined1 *)0x15e71c;
                                                pCVar24 = Eigen::
                                                  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  ::operator_(pCVar24,local_168);
                                                local_170 = 1.0;
                                                puStack_320 = (undefined1 *)0x15e739;
                                                Eigen::
                                                CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                ::operator_(pCVar24,&local_170);
                                                if (((long)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[3] +
                                                  (long)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[1] != 3) ||
                                                  (tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[2] !=
                                                  1.48219693752374e-323)) {
                                                  pcVar25 = 
                                                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::finished() [MatrixType = Eigen::Matrix<double, 3, 3>]"
                                                  ;
LAB_0015ecdc:
                                                  puStack_320 = &LAB_0015ece6;
                                                  __assert_fail(
                                                  "((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                                                  ,
                                                  "/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h"
                                                  ,0x7c,pcVar25);
                                                }
                                                dVar38 = (double)x[0x60].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                pdVar26 = x[0x61].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                pdVar9 = x[0x62].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                dVar39 = (double)x[0x62].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                dVar42 = (double)x[99].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                pdVar40 = x[100].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                dVar6 = (double)x[0x61].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                pdVar27 = x[99].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                dVar41 = (double)x[100].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                lVar36 = 0;
                                                do {
                                                  dVar43 = *(double *)((long)pIVar2 + lVar36);
                                                  dVar7 = *(double *)
                                                           ((long)&x[0x55].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + lVar36);
                                                  dVar8 = *(double *)
                                                           ((long)&x[0x55].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + lVar36);
                                                  pdVar16 = (double *)
                                                            ((long)&x[0x79].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + lVar36);
                                                  *pdVar16 = dVar8 * dVar42 +
                                                             dVar7 * (double)pdVar9 +
                                                             dVar43 * dVar38;
                                                  pdVar16[1] = dVar8 * (double)pdVar40 +
                                                               dVar7 * dVar39 +
                                                               dVar43 * (double)pdVar26;
                                                  *(double *)
                                                   ((long)&x[0x7a].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows + lVar36) =
                                                       dVar8 * dVar41 + dVar7 * (double)pdVar27 +
                                                       dVar43 * dVar6;
                                                  lVar36 = lVar36 + 0x18;
                                                } while (lVar36 != 0x48);
                                                tmp.
                                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                .m_storage.m_data.array[1] = 0.0;
                                                tmp.
                                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                .m_storage.m_data.array[0] = (double)(x + 0x7e);
                                                tmp.
                                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                .m_storage.m_data.array[2] = 4.94065645841247e-324;
                                                tmp.
                                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                .m_storage.m_data.array[3] = 4.94065645841247e-324;
                                                x[0x7e].
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                .m_storage.m_data =
                                                     (double *)
                                                     x[0x5d].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                puStack_320 = (undefined1 *)0x15e85d;
                                                this_02 = Eigen::
                                                  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                                  ::operator_((
                                                  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                                  *)&tmp,(Scalar *)(x + 0x5e));
                                                local_108 = 0.0;
                                                puStack_320 = (undefined1 *)0x15e870;
                                                Eigen::
                                                CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                                ::operator_(this_02,&local_108);
                                                if (((long)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[3] +
                                                  (long)tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[1] != 3) ||
                                                  (tmp.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[2] !=
                                                  4.94065645841247e-324)) {
                                                  pcVar25 = 
                                                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
                                                  ;
                                                  goto LAB_0015ecdc;
                                                }
                                                pdVar9 = x[0x61].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                pdVar27 = x[0x4a].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                dVar6 = (double)x[0x4a].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                dVar38 = (double)x[0x62].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                pdVar40 = x[100].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                pdVar26 = x[0x4b].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                dVar41 = (double)x[0x7e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                x[0x7e].
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                .m_storage.m_data =
                                                     (double *)
                                                     ((double)pdVar26 *
                                                      (double)x[99].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows +
                                                  dVar6 * (double)x[0x62].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data +
                                                  (double)pdVar27 *
                                                  (double)x[0x60].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows +
                                                  (double)x[0x7e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data);
                                                x[0x7e].
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                .m_storage.m_rows =
                                                     (Index)((double)pdVar26 * (double)pdVar40 +
                                                             dVar6 * dVar38 +
                                                             (double)pdVar27 * (double)pdVar9 +
                                                            dVar41);
                                                x[0x7f].
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                .m_storage.m_data =
                                                     (double *)
                                                     ((double)pdVar26 *
                                                      (double)x[100].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows +
                                                  dVar6 * (double)x[99].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data +
                                                  (double)pdVar27 *
                                                  (double)x[0x61].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows +
                                                  (double)x[0x7f].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data);
                                                puStack_320 = (undefined1 *)0x15e942;
                                                Eigen::AngleAxis<double>::operator=
                                                          ((AngleAxis<double> *)
                                                           &x[0x7f].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows,
                                                  (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                   *)&x[0x79].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows);
                                                pdVar27 = x[0x81].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                dVar6 = (double)x[0x80].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data * (double)pdVar27;
                                                auVar15._8_4_ = SUB84(dVar6,0);
                                                auVar15._0_8_ =
                                                     (double)x[0x7f].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows * (double)pdVar27;
                                                auVar15._12_4_ = (int)((ulong)dVar6 >> 0x20);
                                                *(undefined1 (*) [16])
                                                 &x[0x81].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows = auVar15;
                                                x[0x82].
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                .m_storage.m_rows =
                                                     (Index)((double)pdVar27 *
                                                            (double)x[0x80].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows);
                                                uVar35 = (ulong)*(uint *)&x[0x46].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                if ((long)uVar35 <=
                                                    (long)x[0x8e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + -3) {
                                                  lVar36 = x[0x8d].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                  IVar18 = x[0x7e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                  puVar3 = (undefined8 *)(lVar36 + uVar35 * 8);
                                                  *puVar3 = x[0x7e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                  puVar3[1] = IVar18;
                                                  *(double **)(lVar36 + 0x10 + uVar35 * 8) =
                                                       x[0x7f].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                  uVar35 = (ulong)(*(int *)&x[0x46].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + 3);
                                                  if ((long)uVar35 <=
                                                      (long)x[0x8e].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + -3) {
                                                    lVar36 = x[0x8d].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                  pdVar27 = x[0x82].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data;
                                                  pIVar5 = (Index *)(lVar36 + uVar35 * 8);
                                                  *pIVar5 = x[0x81].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                  pIVar5[1] = (Index)pdVar27;
                                                  *(Index *)(lVar36 + 0x10 + uVar35 * 8) =
                                                       x[0x82].
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_rows;
                                                  uVar28 = local_2dc;
                                                  goto LAB_0015e9fc;
                                                  }
                                                }
                                              }
                                            }
LAB_0015eade:
                                            pcVar25 = 
                                            "Eigen::Block<Eigen::Matrix<double, -1, 1>, 3, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
                                            ;
                                          }
                                          goto LAB_0015eb5b;
                                        }
                                      }
                                      goto LAB_0015eaf7;
                                    }
                                  }
                                }
                              }
                            }
                            goto LAB_0015eb2f;
                          }
                        }
                      }
                    }
                  }
LAB_0015eaf7:
                  pcVar25 = 
                  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, 3, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
                  ;
                  goto LAB_0015eb5b;
                }
              }
              pcVar25 = 
              "Eigen::Block<const Eigen::Matrix<double, -1, 1>, 6, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = 6, BlockCols = 1, InnerPanel = false]"
              ;
              goto LAB_0015eb5b;
            }
          }
        }
      }
    }
  }
LAB_0015eb2f:
  pcVar25 = 
  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_0015eb5b:
  puStack_320 = (undefined1 *)0x15eb65;
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,pcVar25);
}

Assistant:

Vector IMUElasticLocalFrameDynamicalSystem::measureDynamics
                (const Vector& x, const Vector& u, unsigned k)
    {
        assertStateVector_(x);
        assertInputVector_(u);

        xk_fory_=x;
        uk_fory_=u;
        op_.k_fory=k;

        op_.positionFlex=x.segment(state::pos,3);
        op_.velocityFlex=x.segment(state::linVel,3);
        op_.orientationFlexV=x.segment(state::ori,3);
        op_.angularVelocityFlex=x.segment(state::angVel,3);

        for (int i=0; i<hrp2::contact::nbModeledMax; ++i)
            op_.efforts[i]=x.segment(state::fc+6*i,6);

        op_.fm=x.segment(state::unmodeledForces,3);
        op_.tm=x.segment(state::unmodeledForces+3,3);
        op_.drift=x.segment<3>(state::drift);

        op_.rFlex =computeRotation_(op_.orientationFlexV,0);

        kine::computeInertiaTensor(u.segment<6>(input::inertia),op_.inertia);
        kine::computeInertiaTensor(u.segment<6>(input::dotInertia),op_.dotInertia);
        unsigned nbContacts(getContactsNumber());
        for (unsigned i = 0; i<nbContacts ; ++i)
        {
            // Positions
            op_.contactPosV.setValue(u.segment<3>(input::contacts + 12*i),i);
            op_.contactOriV.setValue(u.segment<3>(input::contacts +12*i+3),i);
        }
        op_.positionCom=u.segment<3>(input::posCom);
        if(withComBias_) op_.positionCom-=op_.positionComBias;
        op_.velocityCom=u.segment<3>(input::velCom);
        op_.accelerationCom=u.segment<3>(input::accCom);
        op_.AngMomentum=u.segment<3>(input::angMoment);
        op_.dotAngMomentum=u.segment<3>(input::dotAngMoment);

        op_.positionControl=u.segment(input::posIMU,3);
        op_.velocityControl=u.segment(input::linVelIMU,3);
        op_.accelerationControl=u.segment(input::linAccIMU,3);
        op_.orientationControlV=u.segment(input::oriIMU,3);
        op_.angularVelocityControl=u.segment(input::angVelIMU,3);

        op_.rControl=computeRotation_(op_.orientationControlV,1);

        op_.rimu = op_.rFlex * op_.rControl;

        for (int i=0; i<hrp2::contact::nbModeledMax; ++i)
        {
            fc_.segment<3>(3*i) = op_.efforts[i].block<3,1>(0,0);
            tc_.segment<3>(3*i) = op_.efforts[i].block<3,1>(3,0);
        }

        op_.addForce = u.segment<3>(input::additionalForces);
        op_.addMoment = u.segment<3>(input::additionalForces+3);

        // Get acceleration
        computeAccelerations (op_.positionCom, op_.velocityCom,
                  op_.accelerationCom, op_.AngMomentum, op_.dotAngMomentum,
                  op_.inertia, op_.dotInertia,  op_.contactPosV, op_.contactOriV,
                  op_.positionFlex, op_.velocityFlex, op_.linearAcceleration,
                  op_.orientationFlexV, op_.rFlex, op_.angularVelocityFlex,
                  op_.angularAcceleration, fc_, tc_, op_.fm,op_.tm,
                  op_.addForce,op_.addMoment);

        // Translation sensor dynamic
        op_.imuAcc = 2*kine::skewSymmetric(op_.angularVelocityFlex) * op_.rFlex * op_.velocityControl;
        op_.imuAcc += op_.linearAcceleration + op_.rFlex * op_.accelerationControl;
        op_.imuAcc += (
                    kine::skewSymmetric(op_.angularAcceleration)
                    + tools::square(kine::skewSymmetric(op_.angularVelocityFlex))
                )*op_.rFlex * op_.positionControl;

        // Rotation sensor dynamic
        op_.imuOmega = op_.angularVelocityFlex + op_.rFlex * op_.angularVelocityControl;

        // Set sensor state before measurement

        op_.sensorState.resize(sensor_.getStateSize());
        op_.sensorState.head<9>() = Eigen::Map<Eigen::Matrix<double, 9, 1> >(&op_.rimu(0,0));
        op_.sensorState.segment<3>(9)=op_.imuAcc;
        op_.sensorState.segment<3>(12)=op_.imuOmega;

        index_=15;

        if (withForceMeasurements_)
        {
          for (unsigned int i=0; i<nbContacts_; ++i)
          {
            op_.sensorState.segment(index_,6) = x.segment(state::fc+i*6,6);
            // the last part of the measurement is force torque, it is
            // computes by the current functor and not the sensor_.
            // (see AlgebraicSensor::concatenateWithInput
            // for more details
            index_+=6;
          }
        }

        if (withAbsolutePos_)
        {
          op_.cy=cos(op_.drift(2));
          op_.sy=sin(op_.drift(2));
          op_.rdrift<< op_.cy, -op_.sy, 0,
                       op_.sy,  op_.cy, 0,
                       0,       0,      1;
          op_.rtotal.noalias() = op_.rdrift*op_.rFlex;

          op_.ptotal << op_.drift(0),op_.drift(1),0;
          op_.ptotal.noalias() += op_.rdrift*op_.positionFlex;

          op_.aatotal = op_.rtotal;
          op_.oritotal.noalias() = op_.aatotal.angle()*op_.aatotal.axis();

          op_.sensorState.segment<3>(index_) = op_.ptotal;
          op_.sensorState.segment<3>(index_+3) = op_.oritotal;
        }

        sensor_.setState(op_.sensorState,k);

        //measurements
        yk_=sensor_.getMeasurements();
        return yk_;
    }